

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

substr c4::decode_code_point(substr out,csubstr code_point)

{
  char cVar1;
  code *pcVar2;
  bool bVar3;
  size_t sVar4;
  uint32_t code;
  ulong buflen;
  int iVar5;
  ro_substr pattern;
  ro_substr pattern_00;
  ro_substr pattern_01;
  ro_substr pattern_02;
  substr sVar6;
  csubstr code_point_local;
  substr local_38;
  
  code_point_local.len = code_point.len;
  code_point_local.str = code_point.str;
  buflen = out.len;
  if (buflen < 4) {
    if (((byte)s_error_flags & 1) != 0) {
      bVar3 = is_debugger_attached();
      if (bVar3) {
        pcVar2 = (code *)swi(3);
        sVar6 = (substr)(*pcVar2)();
        return sVar6;
      }
    }
    handle_error(0x1e71c6,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x4525,"out.len >= 4");
  }
  pattern.len = 2;
  pattern.str = "U+";
  bVar3 = basic_substring<const_char>::begins_with(&code_point_local,pattern);
  if (bVar3) {
    if (((byte)s_error_flags & 1) != 0) {
      bVar3 = is_debugger_attached();
      if (bVar3) {
        pcVar2 = (code *)swi(3);
        sVar6 = (substr)(*pcVar2)();
        return sVar6;
      }
    }
    handle_error(0x1e71c6,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x4526,"!code_point.begins_with(\"U+\")");
  }
  pattern_00.len = 2;
  pattern_00.str = "\\x";
  bVar3 = basic_substring<const_char>::begins_with(&code_point_local,pattern_00);
  if (bVar3) {
    if (((byte)s_error_flags & 1) != 0) {
      bVar3 = is_debugger_attached();
      if (bVar3) {
        pcVar2 = (code *)swi(3);
        sVar6 = (substr)(*pcVar2)();
        return sVar6;
      }
    }
    handle_error(0x1e71c6,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x4527,"!code_point.begins_with(\"\\\\x\")");
  }
  pattern_01.len = 2;
  pattern_01.str = "\\u";
  bVar3 = basic_substring<const_char>::begins_with(&code_point_local,pattern_01);
  if (!bVar3) {
    pattern_02.len = 2;
    pattern_02.str = "\\U";
    bVar3 = basic_substring<const_char>::begins_with(&code_point_local,pattern_02);
    if (bVar3) {
      if (((byte)s_error_flags & 1) != 0) {
        bVar3 = is_debugger_attached();
        if (bVar3) {
          pcVar2 = (code *)swi(3);
          sVar6 = (substr)(*pcVar2)();
          return sVar6;
        }
      }
      handle_error(0x1e71c6,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x4529,"!code_point.begins_with(\"\\\\U\")");
    }
    if (code_point_local.len != 0) {
      if (*code_point_local.str == '0') {
        if (((byte)s_error_flags & 1) != 0) {
          bVar3 = is_debugger_attached();
          if (bVar3) {
            pcVar2 = (code *)swi(3);
            sVar6 = (substr)(*pcVar2)();
            return sVar6;
          }
        }
        handle_error(0x1e71c6,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x452a,"!code_point.begins_with(\'0\')");
      }
      if (8 < code_point_local.len) {
        if (((byte)s_error_flags & 1) != 0) {
          bVar3 = is_debugger_attached();
          if (bVar3) {
            pcVar2 = (code *)swi(3);
            sVar6 = (substr)(*pcVar2)();
            return sVar6;
          }
        }
        handle_error(0x1e71c6,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x452b,"code_point.len <= 8");
      }
      if (code_point_local.len != 0) {
        if ((code_point_local.len != 0) && (code_point_local.str != (char *)0x0)) {
          sVar4 = 0;
          code = 0;
          while( true ) {
            if (code_point_local.len == sVar4) {
              sVar4 = decode_code_point((uint8_t *)out.str,buflen,code);
              if (sVar4 <= buflen) {
                basic_substring<char>::basic_substring(&local_38,out.str,sVar4);
                return local_38;
              }
              if (((byte)s_error_flags & 1) != 0) {
                bVar3 = is_debugger_attached();
                if (bVar3) {
                  pcVar2 = (code *)swi(3);
                  sVar6 = (substr)(*pcVar2)();
                  return sVar6;
                }
              }
              handle_error(0x1e71c6,
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           ,0x154e,"num <= len || num == npos");
            }
            cVar1 = code_point_local.str[sVar4];
            iVar5 = -0x30;
            if (((9 < (byte)(cVar1 - 0x30U)) && (iVar5 = -0x57, 5 < (byte)(cVar1 + 0x9fU))) &&
               (iVar5 = -0x37, 5 < (byte)(cVar1 + 0xbfU))) break;
            code = code * 0x10 + iVar5 + (int)cVar1;
            sVar4 = sVar4 + 1;
          }
          if (((byte)s_error_flags & 1) != 0) {
            bVar3 = is_debugger_attached();
            if (bVar3) {
              pcVar2 = (code *)swi(3);
              sVar6 = (substr)(*pcVar2)();
              return sVar6;
            }
          }
          handle_error(0x1e71c6,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x452e,"read_hex(code_point, &code_point_val)");
        }
        if (((byte)s_error_flags & 1) != 0) {
          bVar3 = is_debugger_attached();
          if (bVar3) {
            pcVar2 = (code *)swi(3);
            sVar6 = (substr)(*pcVar2)();
            return sVar6;
          }
        }
        handle_error(0x1e71c6,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x2cac,"!s.empty()");
      }
    }
    if (((byte)s_error_flags & 1) != 0) {
      bVar3 = is_debugger_attached();
      if (bVar3) {
        pcVar2 = (code *)swi(3);
        sVar6 = (substr)(*pcVar2)();
        return sVar6;
      }
    }
    handle_error(0x1e71c6,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x452c,"code_point.len > 0");
  }
  if (((byte)s_error_flags & 1) != 0) {
    bVar3 = is_debugger_attached();
    if (bVar3) {
      pcVar2 = (code *)swi(3);
      sVar6 = (substr)(*pcVar2)();
      return sVar6;
    }
  }
  handle_error(0x1e71c6,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
               ,0x4528,"!code_point.begins_with(\"\\\\u\")");
}

Assistant:

substr decode_code_point(substr out, csubstr code_point)
{
    C4_ASSERT(out.len >= 4);
    C4_ASSERT(!code_point.begins_with("U+"));
    C4_ASSERT(!code_point.begins_with("\\x"));
    C4_ASSERT(!code_point.begins_with("\\u"));
    C4_ASSERT(!code_point.begins_with("\\U"));
    C4_ASSERT(!code_point.begins_with('0'));
    C4_ASSERT(code_point.len <= 8);
    C4_ASSERT(code_point.len > 0);
    uint32_t code_point_val;
    C4_CHECK(read_hex(code_point, &code_point_val));
    size_t ret = decode_code_point((uint8_t*)out.str, out.len, code_point_val);
    C4_ASSERT(ret <= 4);
    return out.first(ret);
}